

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall
capnp::SegmentArrayMessageReader::~SegmentArrayMessageReader(SegmentArrayMessageReader *this)

{
  SegmentArrayMessageReader *this_local;
  
  ~SegmentArrayMessageReader(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

SegmentArrayMessageReader::~SegmentArrayMessageReader() noexcept(false) {}